

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucnv_io.cpp
# Opt level: O2

char * ucnv_io_stripASCIIForCompare_63(char *dst,char *name)

{
  byte bVar1;
  bool bVar2;
  char *pcVar3;
  byte *pbVar4;
  byte bVar5;
  char *dstItr;
  
  pcVar3 = dst;
  bVar2 = false;
  do {
    bVar2 = !bVar2;
    pbVar4 = (byte *)name;
    while( true ) {
      name = (char *)(pbVar4 + 1);
      bVar1 = *pbVar4;
      if ((ulong)bVar1 == 0) {
        *dst = 0;
        return pcVar3;
      }
      if ((-1 < (char)bVar1) && (bVar5 = ""[bVar1], bVar5 != 0)) break;
LAB_002a2605:
      bVar2 = true;
      pbVar4 = (byte *)name;
    }
    if (bVar5 == 1) {
      if (bVar2) {
        if ((-1 < (long)*name) && (""[*name] - 1 < 2)) goto LAB_002a2605;
        bVar2 = false;
        bVar5 = bVar1;
      }
      else {
LAB_002a2613:
        bVar2 = true;
        bVar5 = bVar1;
      }
    }
    else {
      if (bVar5 == 2) goto LAB_002a2613;
      bVar2 = false;
    }
    *dst = bVar5;
    dst = (char *)((byte *)dst + 1);
  } while( true );
}

Assistant:

U_CAPI char * U_CALLCONV
ucnv_io_stripASCIIForCompare(char *dst, const char *name) {
    char *dstItr = dst;
    uint8_t type, nextType;
    char c1;
    UBool afterDigit = FALSE;

    while ((c1 = *name++) != 0) {
        type = GET_ASCII_TYPE(c1);
        switch (type) {
        case UIGNORE:
            afterDigit = FALSE;
            continue; /* ignore all but letters and digits */
        case ZERO:
            if (!afterDigit) {
                nextType = GET_ASCII_TYPE(*name);
                if (nextType == ZERO || nextType == NONZERO) {
                    continue; /* ignore leading zero before another digit */
                }
            }
            break;
        case NONZERO:
            afterDigit = TRUE;
            break;
        default:
            c1 = (char)type; /* lowercased letter */
            afterDigit = FALSE;
            break;
        }
        *dstItr++ = c1;
    }
    *dstItr = 0;
    return dst;
}